

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZContBufferedStream.cpp
# Opt level: O1

void __thiscall
TPZContBufferedStream::ConstReadFromBuffer(TPZContBufferedStream *this,char *dest,size_t *nBytes)

{
  ulong uVar1;
  bool bVar2;
  char cVar3;
  ostream *poVar4;
  ulong uVar5;
  char cVar6;
  string __str;
  string msg;
  long *local_70;
  uint local_68;
  long local_60 [2];
  char *local_50;
  long local_48;
  char local_40 [16];
  
  if (*nBytes <= this->fSize) {
    memcpy(dest,this->fFirst,*nBytes);
    return;
  }
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"TPZContBufferedStream: Cannot read ","");
  uVar1 = *nBytes;
  cVar6 = '\x01';
  if (9 < uVar1) {
    uVar5 = uVar1;
    cVar3 = '\x04';
    do {
      cVar6 = cVar3;
      if (uVar5 < 100) {
        cVar6 = cVar6 + -2;
        goto LAB_00b4134a;
      }
      if (uVar5 < 1000) {
        cVar6 = cVar6 + -1;
        goto LAB_00b4134a;
      }
      if (uVar5 < 10000) goto LAB_00b4134a;
      bVar2 = 99999 < uVar5;
      uVar5 = uVar5 / 10000;
      cVar3 = cVar6 + '\x04';
    } while (bVar2);
    cVar6 = cVar6 + '\x01';
  }
LAB_00b4134a:
  local_70 = local_60;
  std::__cxx11::string::_M_construct((ulong)&local_70,cVar6);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_70,local_68,uVar1);
  std::__cxx11::string::_M_append((char *)&local_50,(ulong)local_70);
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
  }
  std::__cxx11::string::append((char *)&local_50);
  uVar1 = this->fSize;
  cVar6 = '\x01';
  if (9 < uVar1) {
    uVar5 = uVar1;
    cVar3 = '\x04';
    do {
      cVar6 = cVar3;
      if (uVar5 < 100) {
        cVar6 = cVar6 + -2;
        goto LAB_00b4140c;
      }
      if (uVar5 < 1000) {
        cVar6 = cVar6 + -1;
        goto LAB_00b4140c;
      }
      if (uVar5 < 10000) goto LAB_00b4140c;
      bVar2 = 99999 < uVar5;
      uVar5 = uVar5 / 10000;
      cVar3 = cVar6 + '\x04';
    } while (bVar2);
    cVar6 = cVar6 + '\x01';
  }
LAB_00b4140c:
  local_70 = local_60;
  std::__cxx11::string::_M_construct((ulong)&local_70,cVar6);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_70,local_68,uVar1);
  std::__cxx11::string::_M_append((char *)&local_50,(ulong)local_70);
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
  }
  std::__cxx11::string::append((char *)&local_50);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,local_50,local_48);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Save/TPZContBufferedStream.cpp"
             ,0x59);
}

Assistant:

void TPZContBufferedStream::ConstReadFromBuffer(char *dest,
        const size_t &nBytes) const {
    if (nBytes > fSize) {
        std::string msg("TPZContBufferedStream: Cannot read ");
        msg.append(std::to_string(nBytes));
        msg.append(" bytes; there are only ");
        msg.append(std::to_string(fSize));
        msg.append(" available.");
        PZError << msg << std::endl;
        DebugStop();
    }
    char *endBuffer = fBuffer + fNAllocatedBytes;
    memcpy(dest, fFirst, nBytes);
}